

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  uint uVar1;
  TransformationComp comp_00;
  const_iterator cVar2;
  bool bVar3;
  size_type sVar4;
  ImportSettings *pIVar5;
  reference ppAVar6;
  ulong uVar7;
  AnimationCurveMap *this_00;
  mapped_type *this_01;
  Model *pMVar8;
  char *pcVar9;
  reference ppVar10;
  string *psVar11;
  aiNodeAnim *paVar12;
  mapped_type *pmVar13;
  long lVar14;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
  *local_7a8;
  aiNodeAnim *local_748;
  aiNodeAnim *inv_1;
  string *local_720;
  string *invName_1;
  aiNodeAnim *inv;
  string *local_6f0;
  string *invName;
  aiNodeAnim *na;
  string *local_6c0;
  string *chain_name;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
  local_6b0;
  TransformationComp local_6a4;
  ulong uStack_6a0;
  TransformationComp comp_1;
  size_t i_1;
  uint bit;
  uint flags;
  const_iterator local_688;
  aiNodeAnim *local_680;
  aiNodeAnim *nd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  format local_650;
  iterator local_4d8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
  local_4d0;
  allocator local_4c1;
  key_type local_4c0;
  iterator local_4a0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
  local_498;
  iterator local_490;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
  local_488;
  TransformationComp local_47c;
  ulong uStack_478;
  TransformationComp comp;
  size_t i;
  bool has_complex;
  bool has_any;
  const_iterator chain [17];
  Model *target;
  format local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  format local_220;
  AnimationCurveNode *local_a8;
  AnimationCurveNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *__range2;
  AnimationCurveNode *curve_node;
  undefined1 local_70 [8];
  NodeMap node_property_map;
  int64_t start_local;
  LayerMap *layer_map_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *curves_local;
  string *fixed_name_local;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims_local;
  FBXConverter *this_local;
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = start;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
         *)local_70);
  sVar4 = std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::size(curves);
  if (sVar4 == 0) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xa92,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pIVar5 = Document::Settings(this->doc);
  validateAnimCurveNodes(curves,(bool)(pIVar5->strictMode & 1));
  __range2 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
              *)0x0;
  __end2 = std::
           vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
           ::begin(curves);
  node = (AnimationCurveNode *)
         std::
         vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
         ::end(curves);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
                                     *)&node), bVar3) {
    ppAVar6 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
              ::operator*(&__end2);
    local_a8 = *ppAVar6;
    if (local_a8 == (AnimationCurveNode *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xa99,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    AnimationCurveNode::TargetProperty_abi_cxx11_(local_a8);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      __range2 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  *)local_a8;
      this_00 = AnimationCurveNode::Curves_abi_cxx11_(local_a8);
      bVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
              ::empty(this_00);
      if (bVar3) {
        psVar11 = Object::Name_abi_cxx11_(&local_a8->super_Object);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target,
                       "no animation curves assigned to AnimationCurveNode: ",psVar11);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target);
        LogFunctions<Assimp::FBXImporter>::LogWarn(&local_3b8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_3b8);
        std::__cxx11::string::~string((string *)&target);
      }
      else {
        psVar11 = AnimationCurveNode::TargetProperty_abi_cxx11_(local_a8);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                                *)local_70,psVar11);
        std::
        vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
        ::push_back(this_01,&local_a8);
      }
    }
    else {
      psVar11 = Object::Name_abi_cxx11_(&local_a8->super_Object);
      std::operator+(&local_240,"target property for animation curve not set: ",psVar11);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_220,
                 &local_240);
      LogFunctions<Assimp::FBXImporter>::LogWarn(&local_220);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
    ::operator++(&__end2);
  }
  if (__range2 ==
      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
       *)0x0) {
    __assert_fail("curve_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaa9,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pMVar8 = AnimationCurveNode::TargetAsModel((AnimationCurveNode *)__range2);
  if (pMVar8 == (Model *)0x0) {
    __assert_fail("curve_node->TargetAsModel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaaa,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  chain[0x10]._M_node = (_Base_ptr)AnimationCurveNode::TargetAsModel((AnimationCurveNode *)__range2)
  ;
  local_7a8 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
               *)&stack0xfffffffffffffb98;
  do {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
    ::_Rb_tree_const_iterator(local_7a8);
    local_7a8 = local_7a8 + 1;
  } while (local_7a8 != chain + 0x10);
  i._7_1_ = 0;
  i._6_1_ = 0;
  for (uStack_478 = 0; uStack_478 < 0x11; uStack_478 = uStack_478 + 1) {
    local_47c = (TransformationComp)uStack_478;
    if ((local_47c == TransformationComp_RotationPivotInverse) ||
       (local_47c == TransformationComp_ScalingPivotInverse)) {
      local_490._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                  *)local_70);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
      ::_Rb_tree_const_iterator(&local_488,&local_490);
      *(_Base_ptr *)(&stack0xfffffffffffffb98 + uStack_478 * 8) = local_488._M_node;
    }
    else {
      pcVar9 = NameTransformationCompProperty(this,local_47c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4c0,pcVar9,&local_4c1);
      local_4a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                   *)local_70,&local_4c0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
      ::_Rb_tree_const_iterator(&local_498,&local_4a0);
      *(_Base_ptr *)(&stack0xfffffffffffffb98 + uStack_478 * 8) = local_498._M_node;
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      lVar14 = uStack_478 * 8;
      local_4d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                  *)local_70);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
      ::_Rb_tree_const_iterator(&local_4d0,&local_4d8);
      bVar3 = std::operator!=((_Self *)(&stack0xfffffffffffffb98 + lVar14),&local_4d0);
      if (bVar3) {
        pIVar5 = Document::Settings(this->doc);
        cVar2 = chain[0x10];
        comp_00 = local_47c;
        if ((pIVar5->optimizeEmptyAnimationCurves & 1U) != 0) {
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                                 *)(&stack0xfffffffffffffb98 + uStack_478 * 8));
          bVar3 = IsRedundantAnimationData(this,(Model *)cVar2._M_node,comp_00,&ppVar10->second);
          if (bVar3) {
            psVar11 = Object::Name_abi_cxx11_((Object *)chain[0x10]._M_node);
            std::operator+(&local_670,"dropping redundant animation channel for node ",psVar11);
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_650,&local_670);
            LogFunctions<Assimp::FBXImporter>::LogDebug(&local_650);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_650);
            std::__cxx11::string::~string((string *)&local_670);
            goto LAB_001dfa84;
          }
        }
        i._7_1_ = 1;
        if (((local_47c != TransformationComp_Rotation) && (local_47c != TransformationComp_Scaling)
            ) && (local_47c != TransformationComp_Translation)) {
          i._6_1_ = 1;
        }
      }
    }
LAB_001dfa84:
  }
  if ((i._7_1_ & 1) == 0) {
    LogFunctions<Assimp::FBXImporter>::LogWarn
              ("ignoring node animation, did not find any transformation key frames");
    nd._4_4_ = 1;
  }
  else if (((i._6_1_ & 1) != 0) ||
          (bVar3 = NeedsComplexTransformationChain(this,(Model *)chain[0x10]._M_node),
          cVar2 = chain[0x10], bVar3)) {
    i_1._4_4_ = 0;
    i_1._0_4_ = 1;
    for (uStack_6a0 = 0; uVar1 = i_1._4_4_, uStack_6a0 < 0x11; uStack_6a0 = uStack_6a0 + 1) {
      local_6a4 = (TransformationComp)uStack_6a0;
      lVar14 = uStack_6a0 * 8;
      chain_name = (string *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                          *)local_70);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
      ::_Rb_tree_const_iterator(&local_6b0,(iterator *)&chain_name);
      bVar3 = std::operator!=((_Self *)(&stack0xfffffffffffffb98 + lVar14),&local_6b0);
      if (bVar3) {
        i_1._4_4_ = (uint)i_1 | i_1._4_4_;
        if (local_6a4 == TransformationComp_RotationPivotInverse) {
          __assert_fail("comp != TransformationComp_RotationPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xafc,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        if (local_6a4 == TransformationComp_ScalingPivotInverse) {
          __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xafd,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        NameTransformationChainNode((string *)&na,this,fixed_name,local_6a4);
        cVar2 = chain[0x10];
        invName = (string *)0x0;
        local_6c0 = (string *)&na;
        if (local_6a4 - TransformationComp_Translation < 3) {
LAB_001dfea1:
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                                 *)(&stack0xfffffffffffffb98 + uStack_6a0 * 8));
          invName = (string *)
                    GenerateTranslationNodeAnim
                              (this,(string *)&na,(Model *)cVar2._M_node,&ppVar10->second,layer_map,
                               node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               stop,max_time,min_time,false);
          if (local_6a4 == TransformationComp_RotationPivot) {
            NameTransformationChainNode
                      ((string *)&inv,this,fixed_name,TransformationComp_RotationPivotInverse);
            cVar2 = chain[0x10];
            local_6f0 = (string *)&inv;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                                   *)(&stack0xfffffffffffffb98 + uStack_6a0 * 8));
            paVar12 = GenerateTranslationNodeAnim
                                (this,(string *)&inv,(Model *)cVar2._M_node,&ppVar10->second,
                                 layer_map,
                                 node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 stop,max_time,min_time,true);
            invName_1 = (string *)paVar12;
            if (paVar12 == (aiNodeAnim *)0x0) {
              __assert_fail("inv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb2e,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            if (((paVar12->mNumPositionKeys == 0) && (paVar12->mNumRotationKeys == 0)) &&
               (paVar12->mNumScalingKeys == 0)) {
              if (paVar12 != (aiNodeAnim *)0x0) {
                aiNodeAnim::~aiNodeAnim(paVar12);
                operator_delete(paVar12);
              }
            }
            else {
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                        (node_anims,(value_type *)&invName_1);
            }
            if (8 < uStack_6a0) {
              __assert_fail("TransformationComp_RotationPivotInverse > i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb36,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            i_1._4_4_ = (uint)i_1 << (9U - (char)uStack_6a0 & 0x1f) | i_1._4_4_;
            std::__cxx11::string::~string((string *)&inv);
          }
          else if (local_6a4 == TransformationComp_ScalingPivot) {
            NameTransformationChainNode
                      ((string *)&inv_1,this,fixed_name,TransformationComp_ScalingPivotInverse);
            cVar2 = chain[0x10];
            local_720 = (string *)&inv_1;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                                   *)(&stack0xfffffffffffffb98 + uStack_6a0 * 8));
            paVar12 = GenerateTranslationNodeAnim
                                (this,(string *)&inv_1,(Model *)cVar2._M_node,&ppVar10->second,
                                 layer_map,
                                 node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 stop,max_time,min_time,true);
            local_748 = paVar12;
            if (paVar12 == (aiNodeAnim *)0x0) {
              __assert_fail("inv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb46,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            if (((paVar12->mNumPositionKeys == 0) && (paVar12->mNumRotationKeys == 0)) &&
               (paVar12->mNumScalingKeys == 0)) {
              if (paVar12 != (aiNodeAnim *)0x0) {
                aiNodeAnim::~aiNodeAnim(paVar12);
                operator_delete(paVar12);
              }
            }
            else {
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                        (node_anims,&local_748);
            }
            if (8 < uStack_6a0) {
              __assert_fail("TransformationComp_RotationPivotInverse > i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb4e,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
            i_1._4_4_ = (uint)i_1 << (9U - (char)uStack_6a0 & 0x1f) | i_1._4_4_;
            std::__cxx11::string::~string((string *)&inv_1);
          }
        }
        else if (local_6a4 - TransformationComp_PreRotation < 3) {
LAB_001dfe01:
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                                 *)(&stack0xfffffffffffffb98 + uStack_6a0 * 8));
          invName = (string *)
                    GenerateRotationNodeAnim
                              (this,(string *)&na,(Model *)cVar2._M_node,&ppVar10->second,layer_map,
                               node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               stop,max_time,min_time);
        }
        else {
          if (local_6a4 - TransformationComp_ScalingOffset < 2) goto LAB_001dfea1;
          if (local_6a4 != TransformationComp_Scaling) {
            if (local_6a4 == TransformationComp_GeometricTranslation) goto LAB_001dfea1;
            if (local_6a4 == TransformationComp_GeometricRotation) goto LAB_001dfe01;
            if (local_6a4 != TransformationComp_GeometricScaling) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb61,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
          }
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                                 *)(&stack0xfffffffffffffb98 + uStack_6a0 * 8));
          invName = (string *)
                    GenerateScalingNodeAnim
                              (this,(string *)&na,(Model *)cVar2._M_node,&ppVar10->second,layer_map,
                               node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               stop,max_time,min_time);
        }
        psVar11 = invName;
        if (invName == (string *)0x0) {
          __assert_fail("na",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb64,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        if (((*(int *)&invName[0x20].field_0x4 == 0) && (*(int *)&invName[0x20].field_2 == 0)) &&
           (*(int *)(invName + 0x21) == 0)) {
          if (invName != (string *)0x0) {
            aiNodeAnim::~aiNodeAnim((aiNodeAnim *)invName);
            operator_delete(psVar11);
          }
        }
        else {
          std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                    (node_anims,(value_type *)&invName);
        }
        nd._4_4_ = 9;
        std::__cxx11::string::~string((string *)&na);
      }
      i_1._0_4_ = (uint)i_1 << 1;
    }
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::operator[](&this->node_anim_chain_bits,fixed_name);
    *pmVar13 = uVar1;
    nd._4_4_ = 0;
  }
  else {
    _bit = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                  *)local_70);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
    ::_Rb_tree_const_iterator(&local_688,(iterator *)&bit);
    paVar12 = GenerateSimpleNodeAnim
                        (this,fixed_name,(Model *)cVar2._M_node,
                         (const_iterator *)&stack0xfffffffffffffb98,local_688,layer_map,
                         node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count,stop,
                         max_time,min_time,true);
    local_680 = paVar12;
    if (paVar12 == (aiNodeAnim *)0x0) {
      __assert_fail("nd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xae6,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    if (((paVar12->mNumPositionKeys == 0) && (paVar12->mNumRotationKeys == 0)) &&
       (paVar12->mNumScalingKeys == 0)) {
      if (paVar12 != (aiNodeAnim *)0x0) {
        aiNodeAnim::~aiNodeAnim(paVar12);
        operator_delete(paVar12);
      }
    }
    else {
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(node_anims,&local_680);
    }
    nd._4_4_ = 1;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
          *)local_70);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = NULL;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }